

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

char * next_boundary(char *startp,char *endp,char *b,size_t blen,int need_crlf)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_R8D;
  char *p;
  char *local_38;
  
  local_38 = in_RDI;
  while( true ) {
    if (in_RSI < local_38 + in_RCX + 2) {
      return (char *)0x0;
    }
    if ((((*local_38 == '-') && (local_38[1] == '-')) &&
        (iVar1 = memcmp(local_38 + 2,in_RDX,in_RCX), iVar1 == 0)) &&
       ((in_R8D == 0 ||
        (((in_RDI + 2 <= local_38 && (local_38[-2] == '\r')) && (local_38[-1] == '\n')))))) break;
    local_38 = local_38 + 1;
  }
  return local_38 + 2;
}

Assistant:

static const char *next_boundary(const char *startp, const char *endp,
                                 const char *b, size_t blen, int need_crlf)
{
    /* scan for the next boundary */
    for (const char *p = startp ; p + 2 + blen <= endp ; ++p)
    {
        /* check for a match */
        if (p[0] != '-' || p[1] != '-' || memcmp(p+2, b, blen) != 0)
            continue;

        /* if we need a newline prefix, check that it's there */
        if (need_crlf && (p < startp + 2 || p[-2] != '\r' || p[-1] != '\n'))
            continue;

        /* it's a match - return the part after the '--' prefix */
        return p + 2;
    }

    /* didn't find it */
    return 0;
}